

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O2

void __thiscall
jwt::verifier<jwt::default_clock>::algo<jwt::algorithm::rs256>::algo
          (algo<jwt::algorithm::rs256> *this,rs256 *a)

{
  (this->super_algo_base)._vptr_algo_base = (_func_int **)&PTR__algo_00112c28;
  algorithm::rsa::rsa(&(this->alg).super_rsa,&a->super_rsa);
  return;
}

Assistant:

explicit algo(T a) : alg(a) {}